

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O2

void capnp::_::PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_capnp::Text::Reader> value)

{
  long lVar1;
  uint index;
  Reader *pRVar2;
  Reader *element;
  PointerBuilder local_68;
  Builder l;
  
  pRVar2 = value.ptr;
  local_68.pointer = builder.pointer;
  local_68.segment = builder.segment;
  local_68.capTable = builder.capTable;
  PointerBuilder::initList(&l.builder,&local_68,POINTER,(ElementCount)value.size_);
  index = 0;
  for (lVar1 = value.size_ << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    List<capnp::Text,_(capnp::Kind)1>::Builder::set
              ((Builder *)&l.builder,index,(Reader)(pRVar2->super_StringPtr).content);
    pRVar2 = pRVar2 + 1;
    index = index + 1;
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }